

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene.cxx
# Opt level: O1

bool __thiscall xray_re::xr_scene::load(xr_scene *this,char *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float *pfVar2;
  uint *puVar3;
  pointer ppxVar4;
  xr_scene_part *pxVar5;
  int iVar6;
  long *plVar7;
  xr_reader *this_00;
  size_t sVar8;
  xr_reader *this_01;
  ulong *puVar9;
  pointer ppxVar10;
  ulong __n;
  undefined1 auVar11 [16];
  string parts_path;
  xr_guid guid;
  uint32_t version;
  xr_reader *s;
  xr_reader *s_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined8 local_78;
  string sStack_70;
  string sStack_6f;
  string sStack_6e;
  string sStack_6d;
  string sStack_6c;
  string sStack_6b;
  string sStack_6a;
  string sStack_69;
  long local_68 [2];
  int local_54;
  xr_reader *local_50;
  char *local_48;
  string *local_40;
  xr_reader *local_38;
  
  if ((xr_file_system::instance()::instance0 == '\0') &&
     (iVar6 = __cxa_guard_acquire(&xr_file_system::instance()::instance0), iVar6 != 0)) {
    xr_file_system::xr_file_system(&xr_file_system::instance::instance0);
    __cxa_atexit(xr_file_system::~xr_file_system,&xr_file_system::instance::instance0,&__dso_handle)
    ;
    __cxa_guard_release(&xr_file_system::instance()::instance0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,name,(allocator<char> *)&local_50);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_78);
  paVar1 = &local_98.field_2;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_98.field_2._M_allocated_capacity = *puVar9;
    local_98.field_2._8_8_ = plVar7[3];
    local_98._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_98.field_2._M_allocated_capacity = *puVar9;
    local_98._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_98._M_string_length = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  this_00 = xr_file_system::r_open
                      (&xr_file_system::instance::instance0,"$maps$",local_98._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (this_00 != (xr_reader *)0x0) {
    sVar8 = xr_reader::r_raw_chunk(this_00,0x9df3,&local_54,4);
    if (sVar8 == 0) {
      msg("no scene version chunk");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                    ,0x118,"bool xray_re::xr_scene::load(const char *)");
    }
    if (local_54 != 5) {
      __assert_fail("version == SCENE_VERSION",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                    ,0x11a,"bool xray_re::xr_scene::load(const char *)");
    }
    local_50 = xr_reader::open_chunk(this_00,0x7711);
    if (local_50 == (xr_reader *)0x0) {
      msg("no level options chunk");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                    ,0x126,"bool xray_re::xr_scene::load(const char *)");
    }
    load_options(this,local_50);
    xr_reader::close_chunk(this_00,&local_50);
    sVar8 = xr_reader::find_chunk(this_00,0x7709);
    if (sVar8 == 0) {
      msg("no scene camera chunk");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                    ,0x12f,"bool xray_re::xr_scene::load(const char *)");
    }
    pfVar2 = (float *)(this_00->field_2).m_p_u32;
    (this_00->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_camera_pos).field_0.field_0.x = *pfVar2;
    pfVar2 = (float *)(this_00->field_2).m_p_u32;
    (this_00->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_camera_pos).field_0.field_0.y = *pfVar2;
    pfVar2 = (float *)(this_00->field_2).m_p_u32;
    (this_00->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_camera_pos).field_0.field_0.z = *pfVar2;
    pfVar2 = (float *)(this_00->field_2).m_p_u32;
    (this_00->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_camera_orient).field_0.field_0.x = *pfVar2;
    pfVar2 = (float *)(this_00->field_2).m_p_u32;
    (this_00->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_camera_orient).field_0.field_0.y = *pfVar2;
    pfVar2 = (float *)(this_00->field_2).m_p_u32;
    (this_00->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_camera_orient).field_0.field_0.z = *pfVar2;
    local_40 = (string *)&this->m_guid;
    local_48 = name;
    sVar8 = xr_reader::r_raw_chunk(this_00,0x7000,local_40,0x10);
    if (sVar8 == 0) {
      msg("no tools GUID chunk");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                    ,0x134,"bool xray_re::xr_scene::load(const char *)");
    }
    xr_scene_revision::load(&this->m_revision,this_00);
    sVar8 = xr_reader::find_chunk(this_00,0x7712);
    if (sVar8 != 0) {
      (this_00->field_2).m_p = (this_00->field_2).m_p + 4;
    }
    load_objects(this,this_00,0x7708,&this->m_objects);
    sVar8 = xr_reader::find_chunk(this_00,0x7710);
    if (sVar8 != 0) {
      puVar3 = (this_00->field_2).m_p_u32;
      (this_00->field_2).m_p = (uint8_t *)(puVar3 + 1);
      __n = (ulong)*puVar3;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&this->m_snap_objects,__n);
      for (; __n != 0; __n = __n - 1) {
        local_98._M_string_length = 0;
        local_98.field_2._M_allocated_capacity =
             local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_98._M_dataplus._M_p = (pointer)paVar1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->m_snap_objects,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        xr_reader::r_sz(this_00,(this->m_snap_objects).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1);
      }
    }
    (*this_00->_vptr_xr_reader[1])(this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,local_48,(allocator<char> *)&local_78);
    std::__cxx11::string::push_back((char)&local_98);
    ppxVar10 = (this->m_parts).
               super__Vector_base<xray_re::xr_scene_part_*,_std::allocator<xray_re::xr_scene_part_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppxVar4 = (this->m_parts).
              super__Vector_base<xray_re::xr_scene_part_*,_std::allocator<xray_re::xr_scene_part_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppxVar10 != ppxVar4) {
      do {
        pxVar5 = *ppxVar10;
        local_78 = local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,local_98._M_dataplus._M_p,
                   local_98._M_dataplus._M_p + local_98._M_string_length);
        std::__cxx11::string::append((char *)&local_78);
        this_01 = xr_file_system::r_open
                            (&xr_file_system::instance::instance0,"$maps$",(char *)local_78);
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        if (this_01 == (xr_reader *)0x0) {
          msg("can\'t load scene part %s",pxVar5->m_file_name);
          __assert_fail("r",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                        ,0x14f,"bool xray_re::xr_scene::load(const char *)");
        }
        sVar8 = xr_reader::r_raw_chunk(this_01,0x7000,(string *)&local_78,0x10);
        if (sVar8 == 0) {
LAB_0018806e:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                        ,0x152,"bool xray_re::xr_scene::load(const char *)");
        }
        auVar11[0] = -(*local_40 == local_78._0_1_);
        auVar11[1] = -(local_40[1] == local_78._1_1_);
        auVar11[2] = -(local_40[2] == local_78._2_1_);
        auVar11[3] = -(local_40[3] == local_78._3_1_);
        auVar11[4] = -(local_40[4] == local_78._4_1_);
        auVar11[5] = -(local_40[5] == local_78._5_1_);
        auVar11[6] = -(local_40[6] == local_78._6_1_);
        auVar11[7] = -(local_40[7] == local_78._7_1_);
        auVar11[8] = -(local_40[8] == sStack_70);
        auVar11[9] = -(local_40[9] == sStack_6f);
        auVar11[10] = -(local_40[10] == sStack_6e);
        auVar11[0xb] = -(local_40[0xb] == sStack_6d);
        auVar11[0xc] = -(local_40[0xc] == sStack_6c);
        auVar11[0xd] = -(local_40[0xd] == sStack_6b);
        auVar11[0xe] = -(local_40[0xe] == sStack_6a);
        auVar11[0xf] = -(local_40[0xf] == sStack_69);
        if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar11[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0018806e;
        local_38 = xr_reader::open_chunk(this_01,pxVar5->m_chunk_id);
        if (local_38 == (xr_reader *)0x0) {
          __assert_fail("s",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene.cxx"
                        ,0x155,"bool xray_re::xr_scene::load(const char *)");
        }
        (*pxVar5->_vptr_xr_scene_part[2])(pxVar5,local_38);
        xr_reader::close_chunk(this_01,&local_38);
        (*this_01->_vptr_xr_reader[1])(this_01);
        ppxVar10 = ppxVar10 + 1;
      } while (ppxVar10 != ppxVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return this_00 != (xr_reader *)0x0;
}

Assistant:

bool xr_scene::load(const char* name)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(PA_MAPS, std::string(name) + ".level");
	if (r == 0)
		return false;

	uint32_t version;
	if (!r->r_chunk<uint32_t>(SCENE_CHUNK_VERSION, version)) {
		msg("no scene version chunk");
		xr_not_expected();
	}
	xr_assert(version == SCENE_VERSION);
	if (version != SCENE_VERSION) {
		msg("unexpected scene version %" PRIu32, version);
		xr_not_expected();
	}

	xr_reader* s = r->open_chunk(SCENE_CHUNK_OPTIONS);
	if (s) {
		load_options(*s);
		r->close_chunk(s);
	} else {
		msg("no level options chunk");
		xr_not_expected();
	}

	if (r->find_chunk(SCENE_CHUNK_CAMERA)) {
		r->r_fvector3(m_camera_pos);
		r->r_fvector3(m_camera_orient);
		r->debug_find_chunk();
	} else {
		msg("no scene camera chunk");
		xr_not_expected();
	}

	if (!r->r_chunk<xr_guid>(TOOLS_CHUNK_GUID, m_guid)) {
		msg("no tools GUID chunk");
		xr_not_expected();
	}

	m_revision.load(*r);

	size_t num_objects = 0;
	if (r->find_chunk(SCENE_CHUNK_COUNT)) {
		num_objects = r->r_u32();
		r->debug_find_chunk();
	}

	load_objects(*r, SCENE_CHUNK_OBJECTS, m_objects);

	if (r->find_chunk(SCENE_CHUNK_SNAP_OBJECTS))
		r->r_seq(r->r_u32(), m_snap_objects, xr_reader::f_r_sz());

	fs.r_close(r);

	std::string parts_path(name);
	parts_path += '\\';
	for (xr_scene_part_vec_it it = m_parts.begin(), end = m_parts.end();
			it != end; ++it) {
		xr_scene_part* part = *it;

		r = fs.r_open(PA_MAPS, parts_path + part->file_name());
		if (r == 0)
			msg("can't load scene part %s", part->file_name());
		xr_assert(r);
		xr_guid guid;
		if (!r->r_chunk<xr_guid>(TOOLS_CHUNK_GUID, guid) || guid != m_guid)
			xr_not_expected();

		xr_reader* s = r->open_chunk(part->chunk_id());
		xr_assert(s);
		if (s) {
			part->load(*s);
			r->close_chunk(s);
		}
		fs.r_close(r);
	}

	return true;
}